

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_declare_keyword(Parser *this)

{
  Type TVar1;
  pointer pTVar2;
  pointer pTVar3;
  AbstractSyntaxNode *pAVar4;
  ostream *poVar5;
  parser_exception *this_00;
  int iVar6;
  Token *pTVar7;
  string local_2e0;
  TokenPosition local_2c0;
  Token local_2a8;
  Token local_250;
  Token local_1f8;
  stringstream buffer;
  ostream local_190 [376];
  
  _buffer = 0x35;
  pAVar4 = AbstractSyntaxNode::add_child
                     (this->current_,(Type *)&buffer,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  iVar6 = this->index_ % this->total_;
  pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar7 = pTVar2 + iVar6;
  TVar1 = pTVar2[iVar6].type_;
  if (TVar1 == kVoid) {
    local_2e0._M_dataplus._M_p._0_4_ = 8;
    AbstractSyntaxNode::add_child(this->current_,(Type *)&local_2e0,pTVar7);
    local_2e0._M_dataplus._M_p._0_4_ = 8;
    match(&local_2a8,this,(Type *)&local_2e0);
    Token::~Token(&local_2a8);
  }
  else {
    if (TVar1 == kReal) {
      local_2e0._M_dataplus._M_p._0_4_ = 7;
      AbstractSyntaxNode::add_child(this->current_,(Type *)&local_2e0,pTVar7);
      local_2e0._M_dataplus._M_p._0_4_ = 7;
      match(&local_250,this,(Type *)&local_2e0);
      pTVar7 = &local_250;
    }
    else {
      if (TVar1 != kInt) {
        poVar5 = std::operator<<(local_190,anon_var_dwarf_77bb8);
        Token::content_abi_cxx11_
                  (&local_2e0,
                   (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                   super__Vector_impl_data._M_start + this->index_ % this->total_);
        poVar5 = std::operator<<(poVar5,(string *)&local_2e0);
        std::operator<<(poVar5,anon_var_dwarf_77c10);
        std::__cxx11::string::~string((string *)&local_2e0);
        this_00 = (parser_exception *)__cxa_allocate_exception(0x40);
        iVar6 = this->index_ % this->total_;
        pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar3 = pTVar2 + iVar6;
        local_2c0.super_Position.row_ = (pTVar3->position_).super_Position.row_;
        local_2c0.super_Position.col_ = (pTVar3->position_).super_Position.col_;
        local_2c0.super_Position._vptr_Position = (_func_int **)&PTR_clear_001599f0;
        local_2c0.length_ = pTVar2[iVar6].position_.length_;
        std::__cxx11::stringbuf::str();
        parser_exception::parser_exception(this_00,&local_2c0,&local_2e0);
        __cxa_throw(this_00,&parser_exception::typeinfo,parser_exception::~parser_exception);
      }
      local_2e0._M_dataplus._M_p._0_4_ = 6;
      AbstractSyntaxNode::add_child(this->current_,(Type *)&local_2e0,pTVar7);
      local_2e0._M_dataplus._M_p._0_4_ = 6;
      match(&local_1f8,this,(Type *)&local_2e0);
      pTVar7 = &local_1f8;
    }
    Token::~Token(pTVar7);
    if ((this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_start[this->index_ % this->total_].type_ == kLeftBracket) {
      parse_array(this);
    }
  }
  this->current_ = this->current_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  return;
}

Assistant:

void Parser::parse_declare_keyword() {
    current_ = current_->add_child(Token::Type::kDeclareKeyword, forward_token());
    std::stringstream buffer;

    if (forward_token().type() == Token::Type::kInt) {
        current_->add_child(Token::Type::kInt, forward_token());
        match(Token::Type::kInt);
        if (forward_token().type() == Token::Type::kLeftBracket) {
            parse_array();
        }
    } else if (forward_token().type() == Token::Type::kReal) {
        current_->add_child(Token::Type::kReal, forward_token());
        match(Token::Type::kReal);
        if (forward_token().type() == Token::Type::kLeftBracket) {
            parse_array();
        }
    } else if (forward_token().type() == Token::Type::kVoid) {
        current_->add_child(Token::Type::kVoid, forward_token());
        match(Token::Type::kVoid);
    } else {
        buffer << "无效的标识符 \"" << forward_token().content() << "\", 定义关键字仅允许 int / real / void";
        throw parser_exception(forward_token().position(), buffer.str());
    }

    current_ = current_->parent();
}